

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O2

errno_t wcsncpy_s(WCHAR *_Dst,size_t _SizeInWords,WCHAR *_Src,size_t _Count)

{
  WCHAR WVar1;
  long lVar2;
  ulong uVar3;
  size_t __n;
  WCHAR *__s;
  size_t sVar4;
  
  if ((_Count == 0 && _SizeInWords == 0) && _Dst == (WCHAR *)0x0) {
    return 0;
  }
  if (_Dst == (WCHAR *)0x0 || _SizeInWords == 0) {
LAB_0035685f:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    return 0x16;
  }
  if (_Count == 0) {
    *_Dst = L'\0';
    if (_SizeInWords < 2) {
      return 0;
    }
    __s = _Dst + 1;
    __n = _SizeInWords * 2 - 2;
    goto LAB_0035698f;
  }
  if (_Src == (WCHAR *)0x0) {
    *_Dst = L'\0';
    if (1 < _SizeInWords) {
      memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
    }
    goto LAB_0035685f;
  }
  if (_Count == 0xffffffffffffffff) {
    sVar4 = 0;
    do {
      WVar1 = _Src[sVar4];
      _Dst[sVar4] = WVar1;
      if (WVar1 == L'\0') goto LAB_00356968;
      sVar4 = sVar4 + 1;
    } while (_SizeInWords != sVar4);
LAB_0035692b:
    if (_Count != 0xffffffffffffffff) {
      *_Dst = L'\0';
      if (1 < _SizeInWords) {
        memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
      }
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
      return 0x22;
    }
    _Dst[_SizeInWords - 1] = L'\0';
    return 0x50;
  }
  lVar2 = -_Count;
  sVar4 = 0;
  do {
    WVar1 = _Src[sVar4];
    _Dst[sVar4] = WVar1;
    if (WVar1 == L'\0') goto LAB_00356968;
    if (_SizeInWords - 1 == sVar4) goto LAB_0035692b;
    sVar4 = sVar4 + 1;
  } while (_Count != sVar4);
  _Dst[sVar4] = L'\0';
LAB_0035696e:
  uVar3 = 1 - lVar2;
  if (_SizeInWords < uVar3 || _SizeInWords - uVar3 == 0) {
    return 0;
  }
  __s = _Dst + uVar3;
  __n = (_SizeInWords - uVar3) * 2;
LAB_0035698f:
  memset(__s,0xfd,__n);
  return 0;
LAB_00356968:
  lVar2 = -sVar4;
  goto LAB_0035696e;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl wcsncpy_s(WCHAR *_Dst, size_t _SizeInWords, const WCHAR *_Src, size_t _Count)
{
    WCHAR *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInWords == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInWords);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInWords);

    p = _Dst;
    available = _SizeInWords;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInWords - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInWords);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInWords, _SizeInWords - available + 1);
    return 0;
}